

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

ZyanStatus
ZydisStringAppendHexS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_leading_number,
          ZyanBool uppercase,ZyanBool force_sign,ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanStatus ZVar1;
  
  if (value < 0) {
    ZVar1 = ZydisStringAppendShort(string,&ZydisStringAppendHexS::str_sub);
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
    if ((prefix != (ZyanStringView *)0x0) &&
       (ZVar1 = ZydisStringAppend(string,prefix), (int)ZVar1 < 0)) {
      return ZVar1;
    }
    value = -value;
    prefix = (ZyanStringView *)0x0;
  }
  else if ((force_sign != '\0') &&
          (ZVar1 = ZydisStringAppendShort(string,&ZydisStringAppendHexS::str_add), (int)ZVar1 < 0))
  {
    return ZVar1;
  }
  ZVar1 = ZydisStringAppendHexU
                    (string,value,padding_length,force_leading_number,uppercase,prefix,suffix);
  return ZVar1;
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendHexS(ZyanString* string, ZyanI64 value,
    ZyanU8 padding_length, ZyanBool force_leading_number, ZyanBool uppercase, ZyanBool force_sign,
    const ZyanStringView* prefix, const ZyanStringView* suffix)
{
    static const ZydisShortString str_add = ZYDIS_MAKE_SHORTSTRING("+");
    static const ZydisShortString str_sub = ZYDIS_MAKE_SHORTSTRING("-");

    if (value < 0)
    {
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_sub));
        if (prefix)
        {
            ZYAN_CHECK(ZydisStringAppend(string, prefix));
        }
        return ZydisStringAppendHexU(string, ZyanAbsI64(value), padding_length,
            force_leading_number, uppercase, (const ZyanStringView*)ZYAN_NULL, suffix);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_add));
    }
    return ZydisStringAppendHexU(string, value, padding_length, force_leading_number, uppercase,
        prefix, suffix);
}